

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void opengv::absolute_pose::modules::upnp_main_sym
               (Matrix<double,_10,_10,_0,_10,_10> *M,Matrix<double,_1,_10,_1,_1,_10> *C,double gamma
               ,vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                *quaternions)

{
  long lVar1;
  undefined8 uVar2;
  int q;
  long lVar3;
  const_iterator __position;
  int i;
  long lVar4;
  ActualDstType actualDst;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  Vector4d quaternion;
  Transpose<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> destT;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  bad_quaternions;
  Matrix<std::complex<double>,_8,_8,_0,_8,_8> V;
  Matrix<double,_8,_8,_0,_8,_8> Action;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> Eig;
  undefined1 local_1420 [16];
  double dStack_1410;
  double dStack_1408;
  double local_13f0;
  Matrix<double,_1,_10,_1,_1,_10> *local_13e8;
  double local_13e0;
  Matrix<double,_1,_10,_1,_1,_10> *local_13d8;
  Scalar local_13d0;
  Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>_> local_13c8;
  Transpose<const_Eigen::Matrix<double,_10,_10,_0,_10,_10>_> local_13c0;
  Transpose<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> local_13b8;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_13b0;
  undefined1 local_1390 [16];
  double dStack_1380;
  double dStack_1378;
  double dStack_1370;
  double dStack_1368;
  double dStack_1360;
  double dStack_1358;
  double local_1350;
  double dStack_1348;
  undefined1 local_1340 [32];
  Matrix<double,_1,_10,_1,_1,_10> local_1320;
  non_const_type local_12d0;
  EigenvectorsType local_12c0;
  EigenBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> local_ec0 [512];
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> local_cc0;
  
  local_13e0 = gamma;
  local_13d8 = C;
  upnp::setupAction_sym_gj(M,C,gamma,(Matrix<double,_8,_8,_0,_8,_8> *)local_ec0);
  lVar4 = 0;
  local_cc0.m_realSchur.m_hess.m_isInitialized = false;
  local_cc0.m_realSchur.m_isInitialized = false;
  local_cc0.m_realSchur.m_matUisUptodate = false;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[0]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[0]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[1]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[1]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[2]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[2]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[3]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[3]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[4]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[4]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[5]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[5]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[6]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[6]._M_value._8_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[7]._M_value._0_8_ = 0;
  local_cc0.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_1,_0,_8,_1>_>.
  m_storage.m_data.array[7]._M_value._8_8_ = 0;
  local_cc0.m_isInitialized = false;
  local_cc0.m_eigenvectorsOk = false;
  local_cc0.m_realSchur.m_maxIters = -1;
  Eigen::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>::compute<Eigen::Matrix<double,8,8,0,8,8>>
            ((EigenSolver<Eigen::Matrix<double,8,8,0,8,8>> *)&local_cc0,local_ec0,true);
  Eigen::EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>::eigenvectors(&local_12c0,&local_cc0);
  local_13b0.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_13b0.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_13b0.
  super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    auVar9 = _local_1420;
    uVar2 = *(undefined8 *)
             (local_12c0.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>.
              m_storage.m_data.array + lVar4 * 8U + 7);
    dStack_1408 = (double)uVar2;
    local_1420 = auVar9._0_16_;
    dStack_1410 = (double)*(undefined8 *)
                           (local_12c0.
                            super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>
                            .m_storage.m_data.array + lVar4 * 8U + 6);
    local_1420._0_8_ = auVar9._0_8_;
    local_1420._8_8_ =
         *(undefined8 *)
          (local_12c0.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>.
           m_storage.m_data.array + lVar4 * 8U + 5);
    lVar3 = 0;
    local_1420._0_8_ =
         *(undefined8 *)
          (local_12c0.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>.
           m_storage.m_data.array + lVar4 * 8U + 4);
    dVar7 = 0.0;
    do {
      lVar1 = lVar3 * 8;
      lVar3 = lVar3 + 1;
      dVar7 = dVar7 + *(double *)(local_1420 + lVar1) * *(double *)(local_1420 + lVar1);
    } while (lVar3 != 4);
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar7;
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar7 = auVar8._0_8_;
    }
    auVar9._8_8_ = dVar7;
    auVar9._0_8_ = dVar7;
    auVar9._16_8_ = dVar7;
    auVar9._24_8_ = dVar7;
    local_13f0 = 2.0;
    local_13e8 = local_13d8;
    local_13d0 = 1.0;
    _local_1420 = vdivpd_avx(_local_1420,auVar9);
    auVar5 = vpermpd_avx512f(_DAT_001e3480,ZEXT3264(_local_1420));
    auVar6 = vpermpd_avx512f(_DAT_001e34c0,ZEXT3264(_local_1420));
    auVar9 = vpermpd_avx2(_local_1420,0xe9);
    auVar8 = vshufpd_avx(local_1420._16_16_,local_1420._16_16_,3);
    local_1350 = auVar9._0_8_ * auVar8._0_8_;
    dStack_1348 = auVar9._8_8_ * auVar8._8_8_;
    _local_1390 = vmulpd_avx512f(auVar5,auVar6);
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [8] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [9] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [1] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [2] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [3] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [5] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [6] = 0.0;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [7] = 0.0;
    local_13c8.m_matrix.m_matrix = (non_const_type)(non_const_type)local_1390;
    local_13c0.m_matrix = M;
    local_13b8.m_matrix = &local_1320;
    local_1340._16_8_ = &local_1320;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Transpose<Eigen::Matrix<double,10,10,0,10,10>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>const>,Eigen::Transpose<Eigen::Matrix<double,1,10,1,1,10>>>
              (&local_13c0,&local_13c8,&local_13b8,&local_13d0);
    local_1340._0_8_ =
         (double)local_1390._0_8_ *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[0] +
         dStack_1380 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[2] +
         dStack_1370 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[4] +
         local_1350 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[8] +
         dStack_1360 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[6] +
         (double)local_1390._8_8_ *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[1] +
         dStack_1378 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[3] +
         dStack_1368 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[5] +
         dStack_1348 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[9] +
         dStack_1358 *
         (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_1340._16_8_)->m_storage
         ).m_data.array[7] +
         (double)local_1390._0_8_ *
         local_13f0 *
         (local_13e8->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
         m_data.array[0] +
         local_13f0 *
         (local_13e8->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
         m_data.array[2] * dStack_1380 +
         dStack_1370 *
         local_13f0 *
         (local_13e8->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
         m_data.array[4] +
         dStack_1360 *
         local_13f0 *
         (local_13e8->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
         m_data.array[6] +
         local_1350 *
         local_13f0 *
         (local_13e8->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
         m_data.array[8] +
         (double)local_1390._8_8_ *
         local_13f0 *
         (local_13e8->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
         m_data.array[1] +
         local_13f0 *
         (local_13e8->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
         m_data.array[3] * dStack_1378 +
         dStack_1368 *
         local_13f0 *
         (local_13e8->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
         m_data.array[5] +
         dStack_1358 *
         local_13f0 *
         (local_13e8->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
         m_data.array[7] +
         dStack_1348 *
         local_13f0 *
         (local_13e8->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.
         m_data.array[9] + local_13e0;
    for (__position._M_current =
              (quaternions->
              super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
        (__position._M_current !=
         (quaternions->
         super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish &&
        ((__position._M_current)->first < (double)local_1340._0_8_));
        __position._M_current = __position._M_current + 1) {
    }
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [0] = (double)local_1420._0_8_;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [1] = (double)local_1420._8_8_;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [2] = dStack_1410;
    local_1320.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
    [3] = dStack_1408;
    local_12d0 = (non_const_type)local_1390;
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::_M_insert_rval(quaternions,__position,(value_type *)local_1340);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  if ((quaternions->
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (quaternions->
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::operator=(quaternions,&local_13b0);
  }
  if (local_13b0.
      super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_13b0.
                 super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [3]);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::upnp_main_sym(
    const Eigen::Matrix<double,10,10> & M,
    const Eigen::Matrix<double,1,10> & C,
    double gamma,
    std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > & quaternions )
{
  Eigen::Matrix<double,8,8> Action;
  upnp::setupAction_sym_gj( M, C, gamma, Action );
  Eigen::EigenSolver< Eigen::Matrix<double,8,8> > Eig( Action, true );
  Eigen::Matrix<std::complex<double>,8,8> V = Eig.eigenvectors();
  
  //ok, let's cut the imaginary solutions (with a reasonable threshold!)
  // const double imagThreshold = 0.01;
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > bad_quaternions;
  
  for( int i = 0; i < 8; i++ )
  {
    Eigen::Vector4d quaternion;
    quaternion[3] = V(7,i).real();
    quaternion[2] = V(6,i).real();
    quaternion[1] = V(5,i).real();
    quaternion[0] = V(4,i).real();
    
    double norm = 0.0;
    for( int q = 0; q < 4; q++ )
      norm += pow(quaternion[q],2.0);
    norm = sqrt(norm);
    for( int q = 0; q < 4; q++ )
      quaternion[q] /= norm;
    
    Eigen::Matrix<double,10,1> s;
    upnp_fill_s(quaternion,s);
    Eigen::Matrix<double,1,1> valueM = s.transpose() * M * s + 2.0 * C * s;
    double value = valueM[0] + gamma;

    if( true )//fabs(D[i].imag()) < imagThreshold ) //use all results for the moment
    {
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = quaternions.begin();
      while( qidx != quaternions.end() && qidx->first < value )
        qidx++;
      
      quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
    else
    {
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = bad_quaternions.begin();
      while( qidx != bad_quaternions.end() && qidx->first < value )
        qidx++;
      
      bad_quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
  }
  if( quaternions.size() == 0 )
    quaternions = bad_quaternions;
}